

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O1

void __thiscall CoinSelection_ConvertToUtxo_Test::TestBody(CoinSelection_ConvertToUtxo_Test *this)

{
  pointer *ppuVar1;
  uint8_t *puVar2;
  AssertHelperData *pAVar3;
  undefined8 uVar4;
  _func_int **pp_Var5;
  bool bVar6;
  char *pcVar7;
  Amount AVar8;
  AssertionResult gtest_ar_5;
  undefined1 local_290 [24];
  AssertionResult gtest_ar_17;
  undefined1 local_268 [23];
  allocator_type local_251;
  ConfidentialAssetId asset;
  undefined1 local_228 [36];
  uint32_t vout;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_11;
  uint64_t block_height;
  void *binary_data;
  Txid txid;
  BlockHash block_hash;
  string output_descriptor;
  Utxo utxo;
  Amount local_78;
  Script locking_script;
  
  block_height = 1;
  puVar2 = utxo.block_hash + 8;
  utxo.block_height = (uint64_t)puVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&utxo,"1234567890123456789012345678901234567890123456789012345678901456","");
  cfd::core::BlockHash::BlockHash(&block_hash,(string *)&utxo);
  if ((uint8_t *)utxo.block_height != puVar2) {
    operator_delete((void *)utxo.block_height);
  }
  utxo.block_height = (uint64_t)puVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&utxo,"0034567890123456789012345678901234567890123456789012345678901456","");
  cfd::core::Txid::Txid(&txid,(string *)&utxo);
  if ((uint8_t *)utxo.block_height != puVar2) {
    operator_delete((void *)utxo.block_height);
  }
  vout = 2;
  utxo.block_height = (uint64_t)puVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&utxo,"0014c59664568fad58004e1fac1b275826d8b525e935","");
  cfd::core::Script::Script(&locking_script,(string *)&utxo);
  if ((uint8_t *)utxo.block_height != puVar2) {
    operator_delete((void *)utxo.block_height);
  }
  output_descriptor._M_dataplus._M_p = (pointer)&output_descriptor.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&output_descriptor,
             "wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1)"
             ,"");
  AVar8 = cfd::core::Amount::CreateBySatoshiAmount(20000);
  local_78.amount_ = AVar8.amount_;
  local_78.ignore_check_ = AVar8.ignore_check_;
  binary_data = &vout;
  memset(&utxo,0,0xd8);
  cfd::CoinSelection::ConvertToUtxo
            (block_height,&block_hash,&txid,vout,&locking_script,&output_descriptor,&local_78,&vout,
             &utxo,(Script *)0x0);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::CoinSelection::ConvertToUtxo
                (block_height,&block_hash,&txid,vout,&locking_script,&output_descriptor,&local_78,
                 binary_data,&utxo,(Script *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&asset);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x295,
               "Expected: (CoinSelection::ConvertToUtxo( block_height, block_hash, txid, vout, locking_script, output_descriptor, amount, binary_data, &utxo)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    if (asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (asset._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
        (**(code **)(*asset._vptr_ConfidentialAssetId + 8))();
      }
      asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    }
  }
  if ((ulong)utxo.script_length != 0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_228,utxo.locking_script,
               utxo.locking_script + utxo.script_length,(allocator_type *)&gtest_ar_2);
    cfd::core::ByteData::ByteData
              ((ByteData *)&gtest_ar_17,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_228);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&asset,(ByteData *)&gtest_ar_17);
    pp_Var5 = asset._vptr_ConfidentialAssetId;
    cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_5,&locking_script);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,
               "ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str()"
               ,"locking_script.GetHex().c_str()",(char *)pp_Var5,(char *)gtest_ar_5._0_8_);
    if ((undefined1 *)gtest_ar_5._0_8_ != local_290) {
      operator_delete((void *)gtest_ar_5._0_8_);
    }
    if (asset._vptr_ConfidentialAssetId !=
        (_func_int **)
        &asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish) {
      operator_delete(asset._vptr_ConfidentialAssetId);
    }
    if (gtest_ar_17._0_8_ != 0) {
      operator_delete((void *)gtest_ar_17._0_8_);
    }
    if ((AssertHelperData *)local_228._0_8_ != (AssertHelperData *)0x0) {
      operator_delete((void *)local_228._0_8_);
    }
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&asset);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x29a,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&asset);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
      if (asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && (asset._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
          (**(code **)(*asset._vptr_ConfidentialAssetId + 8))();
        }
        asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&asset,"utxo.block_height","block_height",&utxo.block_height,&block_height)
  ;
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&asset.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar,utxo.block_hash,
             utxo.txid,(allocator_type *)&gtest_ar_11);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)local_228,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  cfd::core::BlockHash::BlockHash((BlockHash *)&gtest_ar_5,(ByteData256 *)local_228);
  cfd::core::BlockHash::GetHex_abi_cxx11_((string *)&asset,(BlockHash *)&gtest_ar_5);
  pp_Var5 = asset._vptr_ConfidentialAssetId;
  cfd::core::BlockHash::GetHex_abi_cxx11_((string *)&gtest_ar_17,&block_hash);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str()"
             ,"block_hash.GetHex().c_str()",(char *)pp_Var5,(char *)gtest_ar_17._0_8_);
  if ((undefined1 *)gtest_ar_17._0_8_ != local_268) {
    operator_delete((void *)gtest_ar_17._0_8_);
  }
  ppuVar1 = &asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (asset._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
    operator_delete(asset._vptr_ConfidentialAssetId);
  }
  gtest_ar_5._0_8_ = &PTR__BlockHash_00735740;
  if (gtest_ar_5.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar_5.message_.ptr_);
  }
  if ((AssertHelperData *)local_228._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_228._0_8_);
  }
  if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&asset);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    if (asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (asset._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
        (**(code **)(*asset._vptr_ConfidentialAssetId + 8))();
      }
      asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar,utxo.txid,
             (uchar *)&utxo.vout,(allocator_type *)&gtest_ar_11);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)local_228,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  cfd::core::Txid::Txid((Txid *)&gtest_ar_5,(ByteData256 *)local_228);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&asset,(Txid *)&gtest_ar_5);
  pp_Var5 = asset._vptr_ConfidentialAssetId;
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar_17,&txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str()"
             ,"txid.GetHex().c_str()",(char *)pp_Var5,(char *)gtest_ar_17._0_8_);
  if ((undefined1 *)gtest_ar_17._0_8_ != local_268) {
    operator_delete((void *)gtest_ar_17._0_8_);
  }
  if (asset._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
    operator_delete(asset._vptr_ConfidentialAssetId);
  }
  gtest_ar_5._0_8_ = &PTR__Txid_00735400;
  if (gtest_ar_5.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar_5.message_.ptr_);
  }
  if ((AssertHelperData *)local_228._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_228._0_8_);
  }
  if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&asset);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    if (asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (asset._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
        (**(code **)(*asset._vptr_ConfidentialAssetId + 8))();
      }
      asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&asset,"utxo.vout","vout",&utxo.vout,&vout);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&asset.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::GetData((ByteData *)&asset,&locking_script);
  gtest_ar_17._0_8_ = cfd::core::ByteData::GetDataSize((ByteData *)&asset);
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_long>
            ((internal *)&gtest_ar_5,"utxo.script_length","locking_script.GetData().GetDataSize()",
             &utxo.script_length,(unsigned_long *)&gtest_ar_17);
  if (asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
    operator_delete(asset._vptr_ConfidentialAssetId);
  }
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&asset);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a0,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (asset._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
        (**(code **)(*asset._vptr_ConfidentialAssetId + 8))();
      }
      asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_5.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_5._0_2_ = 4;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&asset,"utxo.address_type",
             "static_cast<uint16_t>(AddressType::kP2wpkhAddress)",&utxo.address_type,
             (unsigned_short *)&gtest_ar_5);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a1,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&asset.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_5._0_2_ = 0x6d;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&asset,"utxo.witness_size_max","static_cast<uint16_t>(109)",
             &utxo.witness_size_max,(unsigned_short *)&gtest_ar_5);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&asset.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_5._0_8_ = gtest_ar_5._0_8_ & 0xffffffffffff0000;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&asset,"utxo.uscript_size_max","static_cast<uint16_t>(0)",
             &utxo.uscript_size_max,(unsigned_short *)&gtest_ar_5);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&asset.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_5._0_8_ = cfd::core::Amount::GetSatoshiValue(&local_78);
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)&asset,"utxo.amount","amount.GetSatoshiValue()",&utxo.amount,
             (long *)&gtest_ar_5);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&asset.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<void*,void*>
            ((internal *)&asset,"utxo.binary_data","binary_data",&utxo.binary_data,&binary_data);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&asset.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_5._0_8_ = local_290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar_5,
             "9934567890123456789012345678901234567890123456789012345678901456","");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&gtest_ar_5);
  if ((undefined1 *)gtest_ar_5._0_8_ != local_290) {
    operator_delete((void *)gtest_ar_5._0_8_);
  }
  memset(&utxo,0,0xd8);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::CoinSelection::ConvertToUtxo
                (block_height,&block_hash,&txid,vout,&locking_script,&output_descriptor,&local_78,
                 &asset,binary_data,&utxo,(Script *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2ac,
               "Expected: (CoinSelection::ConvertToUtxo( block_height, block_hash, txid, vout, locking_script, output_descriptor, amount, asset, binary_data, &utxo)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  if ((ulong)utxo.script_length != 0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar,utxo.locking_script,
               utxo.locking_script + utxo.script_length,(allocator_type *)&gtest_ar_11);
    cfd::core::ByteData::ByteData
              ((ByteData *)local_228,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_5,(ByteData *)local_228);
    uVar4 = gtest_ar_5._0_8_;
    cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_17,&locking_script);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,
               "ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str()"
               ,"locking_script.GetHex().c_str()",(char *)uVar4,(char *)gtest_ar_17._0_8_);
    if ((undefined1 *)gtest_ar_17._0_8_ != local_268) {
      operator_delete((void *)gtest_ar_17._0_8_);
    }
    if ((undefined1 *)gtest_ar_5._0_8_ != local_290) {
      operator_delete((void *)gtest_ar_5._0_8_);
    }
    if ((AssertHelperData *)local_228._0_8_ != (AssertHelperData *)0x0) {
      operator_delete((void *)local_228._0_8_);
    }
    if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
      operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_5);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x2b1,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if (gtest_ar_5._0_8_ != 0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
        }
        gtest_ar_5.success_ = false;
        gtest_ar_5._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_2.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_5,"utxo.block_height","block_height",&utxo.block_height,
             &block_height);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)&gtest_ar_17);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (gtest_ar_17._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_17._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_17._0_8_ + 8))();
      }
      gtest_ar_17.success_ = false;
      gtest_ar_17._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_5.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar_2,utxo.block_hash,
             utxo.txid,&local_251);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&gtest_ar,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  cfd::core::BlockHash::BlockHash((BlockHash *)&gtest_ar_17,(ByteData256 *)&gtest_ar);
  cfd::core::BlockHash::GetHex_abi_cxx11_((string *)&gtest_ar_5,(BlockHash *)&gtest_ar_17);
  uVar4 = gtest_ar_5._0_8_;
  cfd::core::BlockHash::GetHex_abi_cxx11_((string *)local_228,&block_hash);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_11,
             "BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str()"
             ,"block_hash.GetHex().c_str()",(char *)uVar4,(char *)local_228._0_8_);
  pAVar3 = (AssertHelperData *)(local_228 + 0x10);
  if ((AssertHelperData *)local_228._0_8_ != pAVar3) {
    operator_delete((void *)local_228._0_8_);
  }
  if ((undefined1 *)gtest_ar_5._0_8_ != local_290) {
    operator_delete((void *)gtest_ar_5._0_8_);
  }
  gtest_ar_17._0_8_ = &PTR__BlockHash_00735740;
  if (gtest_ar_17.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar_17.message_.ptr_);
  }
  if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if ((void *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_));
  }
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_11.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar_2,utxo.txid,
             (uchar *)&utxo.vout,&local_251);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&gtest_ar,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  cfd::core::Txid::Txid((Txid *)&gtest_ar_17,(ByteData256 *)&gtest_ar);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar_5,(Txid *)&gtest_ar_17);
  uVar4 = gtest_ar_5._0_8_;
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_228,&txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_11,
             "Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str()"
             ,"txid.GetHex().c_str()",(char *)uVar4,(char *)local_228._0_8_);
  if ((AssertHelperData *)local_228._0_8_ != pAVar3) {
    operator_delete((void *)local_228._0_8_);
  }
  if ((undefined1 *)gtest_ar_5._0_8_ != local_290) {
    operator_delete((void *)gtest_ar_5._0_8_);
  }
  gtest_ar_17._0_8_ = &PTR__Txid_00735400;
  if (gtest_ar_17.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar_17.message_.ptr_);
  }
  if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if ((void *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_));
  }
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_11.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_5,"utxo.vout","vout",&utxo.vout,&vout);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b6,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)&gtest_ar_17);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (gtest_ar_17._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_17._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_17._0_8_ + 8))();
      }
      gtest_ar_17.success_ = false;
      gtest_ar_17._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_5.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::GetData((ByteData *)&gtest_ar_5,&locking_script);
  local_228._0_8_ = cfd::core::ByteData::GetDataSize((ByteData *)&gtest_ar_5);
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_long>
            ((internal *)&gtest_ar_17,"utxo.script_length","locking_script.GetData().GetDataSize()",
             &utxo.script_length,(unsigned_long *)local_228);
  if (gtest_ar_5._0_8_ != 0) {
    operator_delete((void *)gtest_ar_5._0_8_);
  }
  if (gtest_ar_17.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar_17.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_17.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b7,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_17.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_17._0_2_ = 4;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&gtest_ar_5,"utxo.address_type",
             "static_cast<uint16_t>(AddressType::kP2wpkhAddress)",&utxo.address_type,
             (unsigned_short *)&gtest_ar_17);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b8,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)&gtest_ar_17);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (gtest_ar_17._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_17._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_17._0_8_ + 8))();
      }
      gtest_ar_17.success_ = false;
      gtest_ar_17._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_5.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_17._0_2_ = 0x6d;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&gtest_ar_5,"utxo.witness_size_max","static_cast<uint16_t>(109)",
             &utxo.witness_size_max,(unsigned_short *)&gtest_ar_17);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b9,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)&gtest_ar_17);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (gtest_ar_17._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_17._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_17._0_8_ + 8))();
      }
      gtest_ar_17.success_ = false;
      gtest_ar_17._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_5.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffffffff0000;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&gtest_ar_5,"utxo.uscript_size_max","static_cast<uint16_t>(0)",
             &utxo.uscript_size_max,(unsigned_short *)&gtest_ar_17);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2ba,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)&gtest_ar_17);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (gtest_ar_17._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_17._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_17._0_8_ + 8))();
      }
      gtest_ar_17.success_ = false;
      gtest_ar_17._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_5.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_17._0_8_ = cfd::core::Amount::GetSatoshiValue(&local_78);
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)&gtest_ar_5,"utxo.amount","amount.GetSatoshiValue()",&utxo.amount,
             (long *)&gtest_ar_17);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,699,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)&gtest_ar_17);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (gtest_ar_17._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_17._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_17._0_8_ + 8))();
      }
      gtest_ar_17.success_ = false;
      gtest_ar_17._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_5.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<void*,void*>
            ((internal *)&gtest_ar_5,"utxo.binary_data","binary_data",&utxo.binary_data,&binary_data
            );
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,700,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)&gtest_ar_17);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (gtest_ar_17._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_17._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_17._0_8_ + 8))();
      }
      gtest_ar_17.success_ = false;
      gtest_ar_17._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_5.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar_2,utxo.asset,
             &utxo.field_0xaa,&local_251);
  cfd::core::ByteData::ByteData
            ((ByteData *)&gtest_ar,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar_5,(ByteData *)&gtest_ar);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar_17,(ConfidentialAssetId *)&gtest_ar_5);
  uVar4 = gtest_ar_17._0_8_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_228,&asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_11,
             "ConfidentialAssetId(ByteData(std::vector<uint8_t>(std::begin(utxo.asset), std::end(utxo.asset)))).GetHex().c_str()"
             ,"asset.GetHex().c_str()",(char *)uVar4,(char *)local_228._0_8_);
  if ((AssertHelperData *)local_228._0_8_ != pAVar3) {
    operator_delete((void *)local_228._0_8_);
  }
  if ((undefined1 *)gtest_ar_17._0_8_ != local_268) {
    operator_delete((void *)gtest_ar_17._0_8_);
  }
  gtest_ar_5._0_8_ = &PTR__ConfidentialAssetId_00735710;
  if (gtest_ar_5.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar_5.message_.ptr_);
  }
  if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if ((void *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_));
  }
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2bd,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar_5._0_8_ != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (gtest_ar_5._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
      }
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_11.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output_descriptor._M_dataplus._M_p != &output_descriptor.field_2) {
    operator_delete(output_descriptor._M_dataplus._M_p);
  }
  cfd::core::Script::~Script(&locking_script);
  txid._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(txid.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  block_hash._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00735740;
  if (block_hash.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(block_hash.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CoinSelection, ConvertToUtxo)
{
  uint64_t block_height = 1;
  BlockHash block_hash("1234567890123456789012345678901234567890123456789012345678901456");
  Txid txid("0034567890123456789012345678901234567890123456789012345678901456");
  uint32_t vout = 2;
  Script locking_script("0014c59664568fad58004e1fac1b275826d8b525e935");
  std::string output_descriptor("wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1)");
  Amount amount = Amount::CreateBySatoshiAmount(20000);
  void* binary_data = &vout;
  Utxo utxo = {};
  // std::vector<uint8_t> script_bytes;

  try {
    CoinSelection::ConvertToUtxo(
      block_height, block_hash, txid, vout, locking_script,
      output_descriptor, amount, binary_data, &utxo);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  EXPECT_NO_THROW((CoinSelection::ConvertToUtxo(
    block_height, block_hash, txid, vout, locking_script,
    output_descriptor, amount, binary_data, &utxo)));

  if (utxo.script_length != 0) {
    // script_bytes.resize(utxo.script_length);
    // memcpy(script_bytes.data(), utxo.locking_script, utxo.script_length);
    EXPECT_STREQ(ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str(), locking_script.GetHex().c_str());
  }
  EXPECT_EQ(utxo.block_height, block_height);
  EXPECT_STREQ(BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str(), block_hash.GetHex().c_str());
  EXPECT_STREQ(Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str(), txid.GetHex().c_str());
  EXPECT_EQ(utxo.vout, vout);
  EXPECT_EQ(utxo.script_length, locking_script.GetData().GetDataSize());
  EXPECT_EQ(utxo.address_type, static_cast<uint16_t>(AddressType::kP2wpkhAddress));
  EXPECT_EQ(utxo.witness_size_max, static_cast<uint16_t>(109));
  EXPECT_EQ(utxo.uscript_size_max, static_cast<uint16_t>(0));
  EXPECT_EQ(utxo.amount, amount.GetSatoshiValue());
  EXPECT_EQ(utxo.binary_data, binary_data);

#ifndef CFD_DISABLE_ELEMENTS
  ConfidentialAssetId asset("9934567890123456789012345678901234567890123456789012345678901456");
  memset(&utxo, 0, sizeof(utxo));
  EXPECT_NO_THROW((CoinSelection::ConvertToUtxo(
    block_height, block_hash, txid, vout, locking_script,
    output_descriptor, amount, asset, binary_data, &utxo)));

  if (utxo.script_length != 0) {
    // script_bytes.resize(utxo.script_length);
    // memcpy(script_bytes.data(), utxo.locking_script, utxo.script_length);
    EXPECT_STREQ(ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str(), locking_script.GetHex().c_str());
  }
  EXPECT_EQ(utxo.block_height, block_height);
  EXPECT_STREQ(BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str(), block_hash.GetHex().c_str());
  EXPECT_STREQ(Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str(), txid.GetHex().c_str());
  EXPECT_EQ(utxo.vout, vout);
  EXPECT_EQ(utxo.script_length, locking_script.GetData().GetDataSize());
  EXPECT_EQ(utxo.address_type, static_cast<uint16_t>(AddressType::kP2wpkhAddress));
  EXPECT_EQ(utxo.witness_size_max, static_cast<uint16_t>(109));
  EXPECT_EQ(utxo.uscript_size_max, static_cast<uint16_t>(0));
  EXPECT_EQ(utxo.amount, amount.GetSatoshiValue());
  EXPECT_EQ(utxo.binary_data, binary_data);
  EXPECT_STREQ(ConfidentialAssetId(ByteData(std::vector<uint8_t>(std::begin(utxo.asset), std::end(utxo.asset)))).GetHex().c_str(), asset.GetHex().c_str());
#endif                // CFD_DISABLE_ELEMENTS
}